

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

StructT * __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeStruct
          (StructT *__return_storage_ptr__,TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *this,
          FieldsT *fields)

{
  _Vector_base<wasm::Field,_std::allocator<wasm::Field>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start =
       (fields->second).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (fields->second).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (fields->second).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (fields->second).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (fields->second).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (fields->second).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct>::
  pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct,_true>
            (__return_storage_ptr__,&fields->first,(Struct *)&local_28);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

StructT makeStruct(FieldsT& fields) {
    return {std::move(fields.first), Struct(std::move(fields.second))};
  }